

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CALLBACK::Load
          (_Type_CALLBACK *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *pMVar1;
  uchar uVar2;
  uint uVar3;
  uint l;
  Callback *__p;
  Variable *t;
  long *plVar4;
  offset_in_Memory_to_subr in_R8;
  Memory *local_290;
  Namer local_228;
  Nullable<LiteScript::Variable> local_1e0;
  Callback local_1c0;
  Callback local_110;
  Callback *local_60;
  Callback *C;
  allocator<LiteScript::Callback> local_41;
  Memory *pMStack_40;
  allocator<LiteScript::Callback> allocator;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  istream *stream_local;
  _Type_CALLBACK *this_local;
  
  pMStack_40 = (Memory *)caller;
  Object::Reassign(object,(Type *)_type_callback,0xb0);
  std::allocator<LiteScript::Callback>::allocator(&local_41);
  __p = Object::GetData<LiteScript::Callback>(object);
  __gnu_cxx::new_allocator<LiteScript::Callback>::
  construct<LiteScript::Callback,LiteScript::Memory&>
            ((new_allocator<LiteScript::Callback> *)&local_41,__p,object->memory);
  local_60 = Object::GetData<LiteScript::Callback>(object);
  uVar2 = IStreamer::Read<unsigned_char>(stream);
  if (uVar2 == '\0') {
    pMVar1 = object->memory;
    uVar3 = IStreamer::Read<unsigned_int>(stream);
    Callback::Callback(&local_110,pMVar1,uVar3);
    Callback::operator=(local_60,&local_110);
    Callback::~Callback(&local_110);
  }
  else {
    pMVar1 = object->memory;
    uVar3 = IStreamer::Read<unsigned_int>(stream);
    l = IStreamer::Read<unsigned_int>(stream);
    Callback::Callback(&local_1c0,pMVar1,uVar3,l);
    Callback::operator=(local_60,&local_1c0);
    Callback::~Callback(&local_1c0);
  }
  uVar2 = IStreamer::Read<unsigned_char>(stream);
  if (uVar2 == '\x01') {
    pMVar1 = object->memory;
    plVar4 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
    if (((ulong)pMStack_40 & 1) == 0) {
      local_290 = pMStack_40;
    }
    else {
      local_290 = *(Memory **)((long)(pMStack_40->arr)._M_elems + *plVar4 + -1);
    }
    uVar3 = (*(code *)local_290)(plVar4,stream);
    Memory::GetVariable(&local_1e0,pMVar1,uVar3);
    t = Nullable<LiteScript::Variable>::operator*(&local_1e0);
    Nullable<LiteScript::Variable>::operator=(&local_60->This,t);
    Nullable<LiteScript::Variable>::~Nullable(&local_1e0);
  }
  uVar2 = IStreamer::Read<unsigned_char>(stream);
  if (uVar2 == '\x01') {
    Namer::Load(&local_228,(Namer *)stream,(istream *)object->memory,pMStack_40,in_R8);
    Nullable<LiteScript::Namer>::operator=(&local_60->nsp,&local_228);
    Namer::~Namer(&local_228);
  }
  std::allocator<LiteScript::Callback>::~allocator(&local_41);
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::CALLBACK, sizeof(Callback));
    std::allocator<Callback> allocator;
    allocator.construct(&object.GetData<Callback>(), object.memory);
    Callback& C = object.GetData<Callback>();
    if (IStreamer::Read<unsigned char>(stream) == 0)
        C = Callback(object.memory, IStreamer::Read<unsigned int>(stream));
    else
        C = Callback(object.memory, IStreamer::Read<unsigned int>(stream), IStreamer::Read<unsigned int>(stream));
    if (IStreamer::Read<unsigned char>(stream) == 1)
        C.This = *object.memory.GetVariable((object.memory.*caller)(stream));
    if (IStreamer::Read<unsigned char>(stream) == 1)
        C.nsp = Namer::Load(stream, object.memory, caller);
}